

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_cell_tuv_supported(REF_GEOM ref_geom,REF_INT *nodes,REF_INT type,REF_BOOL *supported)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL tri_supported;
  REF_INT geom2;
  REF_INT geom1;
  REF_INT geom0;
  REF_INT id;
  REF_INT node_per;
  REF_BOOL *supported_local;
  REF_INT *pRStack_20;
  REF_INT type_local;
  REF_INT *nodes_local;
  REF_GEOM ref_geom_local;
  
  *supported = 1;
  _id = supported;
  supported_local._4_4_ = type;
  pRStack_20 = nodes;
  nodes_local = &ref_geom->n;
  if ((type < 1) || (2 < type)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2c4,
           "ref_geom_cell_tuv_supported","type not allowed");
    return 1;
  }
  geom0 = type + 1;
  geom1 = nodes[geom0];
  if (type == 2) {
    uVar1 = ref_geom_tri_supported(ref_geom,nodes,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2ca,
             "ref_geom_cell_tuv_supported",(ulong)uVar1,"tri support");
      return uVar1;
    }
    if (ref_private_macro_code_rss_1 == 0) {
      *_id = 1;
      return 0;
    }
  }
  if (supported_local._4_4_ == 1) {
    uVar1 = ref_geom_find((REF_GEOM)nodes_local,*pRStack_20,1,geom1,&geom2);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2d3,
             "ref_geom_cell_tuv_supported",(ulong)uVar1,"not found");
      return uVar1;
    }
    uVar1 = ref_geom_find((REF_GEOM)nodes_local,pRStack_20[1],supported_local._4_4_,geom1,
                          &tri_supported);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2d4,
             "ref_geom_cell_tuv_supported",(ulong)uVar1,"not found");
      return uVar1;
    }
    if (((*(int *)(*(long *)(nodes_local + 4) + (long)(geom2 * 6 + 3) * 4) != 0) ||
        (*(int *)(*(long *)(nodes_local + 4) + (long)(geom2 * 6 + 4) * 4) != 0)) &&
       ((*(int *)(*(long *)(nodes_local + 4) + (long)(tri_supported * 6 + 3) * 4) != 0 ||
        (*(int *)(*(long *)(nodes_local + 4) + (long)(tri_supported * 6 + 4) * 4) != 0)))) {
      *_id = 0;
    }
  }
  else {
    if (supported_local._4_4_ != 2) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2eb,
             "ref_geom_cell_tuv_supported",6,"can\'t to geom type yet");
      return 6;
    }
    uVar1 = ref_geom_find((REF_GEOM)nodes_local,*pRStack_20,2,geom1,&geom2);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2de,
             "ref_geom_cell_tuv_supported",(ulong)uVar1,"not found");
      return uVar1;
    }
    uVar1 = ref_geom_find((REF_GEOM)nodes_local,pRStack_20[1],supported_local._4_4_,geom1,
                          &tri_supported);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2df,
             "ref_geom_cell_tuv_supported",(ulong)uVar1,"not found");
      return uVar1;
    }
    uVar1 = ref_geom_find((REF_GEOM)nodes_local,pRStack_20[2],supported_local._4_4_,geom1,
                          &ref_private_macro_code_rss);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2e0,
             "ref_geom_cell_tuv_supported",(ulong)uVar1,"not found");
      return uVar1;
    }
    if (((*(int *)(*(long *)(nodes_local + 4) + (long)(geom2 * 6 + 3) * 4) != 0) ||
        (*(int *)(*(long *)(nodes_local + 4) + (long)(geom2 * 6 + 4) * 4) != 0)) &&
       (((*(int *)(*(long *)(nodes_local + 4) + (long)(tri_supported * 6 + 3) * 4) != 0 ||
         (*(int *)(*(long *)(nodes_local + 4) + (long)(tri_supported * 6 + 4) * 4) != 0)) &&
        ((*(int *)(*(long *)(nodes_local + 4) + (long)(ref_private_macro_code_rss * 6 + 3) * 4) != 0
         || (*(int *)(*(long *)(nodes_local + 4) + (long)(ref_private_macro_code_rss * 6 + 4) * 4)
             != 0)))))) {
      *_id = 0;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_cell_tuv_supported(REF_GEOM ref_geom,
                                               REF_INT *nodes, REF_INT type,
                                               REF_BOOL *supported) {
  REF_INT node_per;
  REF_INT id, geom0, geom1, geom2;
  REF_BOOL tri_supported;

  *supported = REF_TRUE;

  RAS(1 <= type && type <= 2, "type not allowed");
  node_per = type + 1;
  id = nodes[node_per];

  /* protects unsupported meshlink tri */
  if (REF_GEOM_FACE == type) {
    RSS(ref_geom_tri_supported(ref_geom, nodes, &tri_supported), "tri support");
    if (!tri_supported) { /* no geom support */
      *supported = 1.0;
      return REF_SUCCESS;
    }
  }

  switch (type) {
    case REF_GEOM_EDGE:
      RSS(ref_geom_find(ref_geom, nodes[0], type, id, &geom0), "not found");
      RSS(ref_geom_find(ref_geom, nodes[1], type, id, &geom1), "not found");

      if ((0 != ref_geom_jump(ref_geom, geom0) ||
           0 != ref_geom_degen(ref_geom, geom0)) &&
          (0 != ref_geom_jump(ref_geom, geom1) ||
           0 != ref_geom_degen(ref_geom, geom1))) {
        *supported = REF_FALSE;
      }
      break;
    case REF_GEOM_FACE:
      RSS(ref_geom_find(ref_geom, nodes[0], type, id, &geom0), "not found");
      RSS(ref_geom_find(ref_geom, nodes[1], type, id, &geom1), "not found");
      RSS(ref_geom_find(ref_geom, nodes[2], type, id, &geom2), "not found");
      if ((0 != ref_geom_jump(ref_geom, geom0) ||
           0 != ref_geom_degen(ref_geom, geom0)) &&
          (0 != ref_geom_jump(ref_geom, geom1) ||
           0 != ref_geom_degen(ref_geom, geom1)) &&
          (0 != ref_geom_jump(ref_geom, geom2) ||
           0 != ref_geom_degen(ref_geom, geom2))) {
        *supported = REF_FALSE;
      }
      break;
    default:
      RSS(REF_IMPLEMENT, "can't to geom type yet");
  }

  return REF_SUCCESS;
}